

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::TestSpecParser::separate(TestSpecParser *this)

{
  size_t sVar1;
  TestSpecParser *this_local;
  
  if ((this->m_mode == QuotedName) || (this->m_mode == Tag)) {
    this->m_mode = None;
    sVar1 = std::__cxx11::string::size();
    this->m_pos = sVar1;
    std::__cxx11::string::clear();
    std::__cxx11::string::clear();
    this->m_realPatternPos = 0;
    this_local._7_1_ = false;
  }
  else {
    endMode(this);
    addFilter(this);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TestSpecParser::separate() {
        if ((m_mode == QuotedName) || (m_mode == Tag)) {
            //invalid argument, signal failure to previous scope.
            m_mode = None;
            m_pos = m_arg.size();
            m_substring.clear();
            m_patternName.clear();
            m_realPatternPos = 0;
            return false;
        }
        endMode();
        addFilter();
        return true; //success
    }